

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightcollection.cpp
# Opt level: O0

Light * newLight(Json *conf)

{
  bool bVar1;
  EnvLight *pEVar2;
  string *s;
  undefined8 *puVar3;
  vec3f vVar4;
  Color *in_stack_fffffffffffffe18;
  point *in_stack_fffffffffffffe20;
  Color *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe38 [16];
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  string *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffea0;
  string local_100 [32];
  string local_e0 [32];
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 local_20;
  float local_18;
  EnvLight *local_8;
  
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
  if (bVar1) {
    pEVar2 = (EnvLight *)operator_new(0x28);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    local_38 = vVar4.z;
    local_40 = vVar4._0_8_;
    local_20 = local_40;
    local_18 = local_38;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    local_58 = vVar4.z;
    local_60 = vVar4._0_8_;
    local_50 = local_60;
    local_48 = local_58;
    PointLight::PointLight
              ((PointLight *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    local_8 = pEVar2;
  }
  else {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar1 = nlohmann::operator==<const_char_*,_0>
                      (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
    if (bVar1) {
      pEVar2 = (EnvLight *)operator_new(0x28);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)pEVar2,in_stack_fffffffffffffe98);
      vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_78 = vVar4.z;
      local_80 = vVar4._0_8_;
      local_70 = local_80;
      local_68 = local_78;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)pEVar2,in_stack_fffffffffffffe98);
      vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_98 = vVar4.z;
      local_a0 = vVar4._0_8_;
      local_90 = local_a0;
      local_88 = local_98;
      DirectionalLight::DirectionalLight
                (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_,
                 (point *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_8 = pEVar2;
    }
    else {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      bVar1 = nlohmann::operator==<const_char_*,_0>
                        (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
      if (bVar1) {
        pEVar2 = (EnvLight *)operator_new(0x18);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        vVar4 = json2vec3f((Json *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        local_b8 = vVar4.z;
        local_c0 = vVar4._0_8_;
        local_b0 = local_c0;
        local_a8 = local_b8;
        ConstEnvLight::ConstEnvLight
                  ((ConstEnvLight *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_8 = pEVar2;
      }
      else {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        bVar1 = nlohmann::operator==<const_char_*,_0>
                          (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
        if (!bVar1) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "unrecognized type of light source";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
        pEVar2 = (EnvLight *)operator_new(0x18);
        operator_new(0x10);
        s = (string *)
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)s);
        getpath(s);
        Image::Image((Image *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe78);
        EnvLight::EnvLight(pEVar2,(Image *)s);
        local_8 = pEVar2;
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_100);
      }
    }
  }
  return &local_8->super_Light;
}

Assistant:

Light* newLight(const Json& conf) {
	if (conf["type"] == "point")
		return new PointLight(json2vec3f(conf["intensity"]), json2vec3f(conf["position"]));
	if (conf["type"] == "directional")
		return new DirectionalLight(json2vec3f(conf["irradiance"]), json2vec3f(conf["direction"]));
	if (conf["type"] == "constant")
		return new ConstEnvLight(json2vec3f(conf["radiance"]));
	if (conf["type"] == "envmap")
		return new EnvLight(new Image(getpath(conf["radiance"])));
	throw "unrecognized type of light source";
}